

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

void duckdb_zstd::ZSTD_window_enforceMaxDist
               (ZSTD_window_t *window,void *blockEnd,U32 maxDist,U32 *loadedDictEndPtr,
               ZSTD_matchState_t **dictMatchStatePtr)

{
  uint uVar1;
  U32 local_38;
  U32 newLowLimit;
  U32 loadedDictEnd;
  U32 blockEndIdx;
  ZSTD_matchState_t **dictMatchStatePtr_local;
  U32 *loadedDictEndPtr_local;
  U32 maxDist_local;
  void *blockEnd_local;
  ZSTD_window_t *window_local;
  
  uVar1 = (int)blockEnd - (int)window->base;
  if (loadedDictEndPtr == (U32 *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = *loadedDictEndPtr;
  }
  if (maxDist + local_38 < uVar1) {
    uVar1 = uVar1 - maxDist;
    if (window->lowLimit < uVar1) {
      window->lowLimit = uVar1;
    }
    if (window->dictLimit < window->lowLimit) {
      window->dictLimit = window->lowLimit;
    }
    if (loadedDictEndPtr != (U32 *)0x0) {
      *loadedDictEndPtr = 0;
    }
    if (dictMatchStatePtr != (ZSTD_matchState_t **)0x0) {
      *dictMatchStatePtr = (ZSTD_matchState_t *)0x0;
    }
  }
  return;
}

Assistant:

MEM_STATIC void
ZSTD_window_enforceMaxDist(ZSTD_window_t* window,
                     const void* blockEnd,
                           U32   maxDist,
                           U32*  loadedDictEndPtr,
                     const ZSTD_matchState_t** dictMatchStatePtr)
{
    U32 const blockEndIdx = (U32)((BYTE const*)blockEnd - window->base);
    U32 const loadedDictEnd = (loadedDictEndPtr != NULL) ? *loadedDictEndPtr : 0;
    DEBUGLOG(5, "ZSTD_window_enforceMaxDist: blockEndIdx=%u, maxDist=%u, loadedDictEnd=%u",
                (unsigned)blockEndIdx, (unsigned)maxDist, (unsigned)loadedDictEnd);

    /* - When there is no dictionary : loadedDictEnd == 0.
         In which case, the test (blockEndIdx > maxDist) is merely to avoid
         overflowing next operation `newLowLimit = blockEndIdx - maxDist`.
       - When there is a standard dictionary :
         Index referential is copied from the dictionary,
         which means it starts from 0.
         In which case, loadedDictEnd == dictSize,
         and it makes sense to compare `blockEndIdx > maxDist + dictSize`
         since `blockEndIdx` also starts from zero.
       - When there is an attached dictionary :
         loadedDictEnd is expressed within the referential of the context,
         so it can be directly compared against blockEndIdx.
    */
    if (blockEndIdx > maxDist + loadedDictEnd) {
        U32 const newLowLimit = blockEndIdx - maxDist;
        if (window->lowLimit < newLowLimit) window->lowLimit = newLowLimit;
        if (window->dictLimit < window->lowLimit) {
            DEBUGLOG(5, "Update dictLimit to match lowLimit, from %u to %u",
                        (unsigned)window->dictLimit, (unsigned)window->lowLimit);
            window->dictLimit = window->lowLimit;
        }
        /* On reaching window size, dictionaries are invalidated */
        if (loadedDictEndPtr) *loadedDictEndPtr = 0;
        if (dictMatchStatePtr) *dictMatchStatePtr = NULL;
    }
}